

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.c
# Opt level: O3

void threaded_tests(zt_unit_test *test,void *data)

{
  zt_log_ty *log;
  zt_log_ty *log_00;
  char *pcVar1;
  undefined8 uVar2;
  int iVar3;
  pthread_t t2;
  pthread_t t1;
  pthread_t local_40;
  pthread_t local_38;
  
  log = zt_log_file("test.log",1,0);
  log_00 = zt_log_logger(log);
  iVar3 = 100;
  do {
    pthread_create(&local_38,(pthread_attr_t *)0x0,log_1,(void *)0x0);
    pthread_create(&local_40,(pthread_attr_t *)0x0,log_2,&local_38);
    pthread_join(local_40,(void **)0x0);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  if (_count1 == 100) {
    zt_unit_test_add_assertion(test);
    if (_count2 == 100) {
      zt_unit_test_add_assertion(test);
      zt_log_logger(log_00);
      zt_log_close(log);
      unlink("test.log");
      return;
    }
    pcVar1 = "_count2 == 100";
    uVar2 = 0xc3;
  }
  else {
    pcVar1 = "_count1 == 100";
    uVar2 = 0xc2;
  }
  iVar3 = zt_unit_printf(&test->error,"%s : %s:%d",pcVar1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
                         ,uVar2);
  if (iVar3 == 0) {
    test->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)test->env,1);
}

Assistant:

void
threaded_tests(struct zt_unit_test *test, void *data UNUSED) {
    pthread_t   t1;
    pthread_t   t2;
    int         i;
    zt_log_ty   * lfile;
    zt_log_ty   * ologger;

    lfile = zt_log_file( "test.log", ZT_LOG_FILE_APPEND, 0);
    ologger = zt_log_logger(lfile);

    for(i = 0; i < 100; i++) {
        pthread_create(&t1, NULL, log_1, NULL);
        pthread_create(&t2, NULL, log_2, &t1);

        pthread_join(t2, NULL);
    }

    ZT_UNIT_ASSERT(test, _count1 == 100);
    ZT_UNIT_ASSERT(test, _count2 == 100);

    zt_log_logger(ologger);
    zt_log_close(lfile);

    unlink("test.log");
}